

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bandwidth_sampler.cc
# Opt level: O3

BandwidthSample * __thiscall
quic::BandwidthSampler::OnPacketAcknowledgedInner
          (BandwidthSample *__return_storage_ptr__,BandwidthSampler *this,QuicTime ack_time,
          QuicPacketNumber packet_number,ConnectionStateOnSentPacket *sent_packet)

{
  long lVar1;
  long lVar2;
  QuicByteCount QVar3;
  QuicByteCount QVar4;
  undefined6 uVar5;
  bool bVar6;
  QuicByteCount QVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  AckPoint local_38;
  
  QVar7 = this->total_bytes_acked_ + sent_packet->size;
  this->total_bytes_acked_ = QVar7;
  this->total_bytes_sent_at_last_acked_packet_ = (sent_packet->send_time_state).total_bytes_sent;
  (this->last_acked_packet_sent_time_).time_ = (sent_packet->sent_time).time_;
  (this->last_acked_packet_ack_time_).time_ = ack_time.time_;
  if (this->overestimate_avoidance_ == true) {
    lVar1 = (this->recent_ack_points_).ack_points_[1].ack_time.time_;
    if (ack_time.time_ < lVar1) {
LAB_0011762b:
      (this->recent_ack_points_).ack_points_[1].ack_time.time_ = ack_time.time_;
    }
    else if (lVar1 < ack_time.time_) {
      (this->recent_ack_points_).ack_points_[0].ack_time.time_ = lVar1;
      (this->recent_ack_points_).ack_points_[0].total_bytes_acked =
           (this->recent_ack_points_).ack_points_[1].total_bytes_acked;
      goto LAB_0011762b;
    }
    (this->recent_ack_points_).ack_points_[1].total_bytes_acked = QVar7;
  }
  if (this->started_as_app_limited_ == true) {
    if (this->is_app_limited_ == false) goto LAB_0011767b;
    bVar6 = QuicPacketNumber::IsInitialized(&this->end_of_app_limited_phase_);
    if (bVar6) goto LAB_0011766e;
  }
  else {
    if ((this->is_app_limited_ == false) ||
       (bVar6 = QuicPacketNumber::IsInitialized(&this->end_of_app_limited_phase_), !bVar6))
    goto LAB_0011767b;
LAB_0011766e:
    if (packet_number.packet_number_ <= (this->end_of_app_limited_phase_).packet_number_)
    goto LAB_0011767b;
  }
  this->is_app_limited_ = false;
LAB_0011767b:
  lVar1 = (sent_packet->last_acked_packet_sent_time).time_;
  if (lVar1 != 0) {
    lVar2 = (sent_packet->sent_time).time_;
    uVar9 = lVar2 - lVar1;
    if (uVar9 == 0 || lVar2 < lVar1) {
      uVar10 = 0x7fffffffffffffff;
    }
    else {
      uVar9 = (((sent_packet->send_time_state).total_bytes_sent -
               sent_packet->total_bytes_sent_at_last_acked_packet) * 8000000) / uVar9;
      uVar10 = 0;
      if (0 < (long)uVar9) {
        uVar10 = uVar9;
      }
    }
    local_38.ack_time.time_ = 0;
    local_38.total_bytes_acked = 0;
    if ((this->overestimate_avoidance_ != true) ||
       (bVar6 = ChooseA0Point(this,(sent_packet->send_time_state).total_bytes_acked,&local_38),
       !bVar6)) {
      local_38.ack_time.time_ = (sent_packet->last_acked_packet_ack_time).time_;
      local_38.total_bytes_acked = (sent_packet->send_time_state).total_bytes_acked;
    }
    if (ack_time.time_ - local_38.ack_time.time_ != 0 && local_38.ack_time.time_ <= ack_time.time_)
    {
      uVar8 = ((this->total_bytes_acked_ - local_38.total_bytes_acked) * 8000000) /
              (ulong)(ack_time.time_ - local_38.ack_time.time_);
      uVar9 = 0;
      if (0 < (long)uVar8) {
        uVar9 = uVar8;
      }
      if (uVar10 <= uVar9) {
        uVar9 = uVar10;
      }
      (__return_storage_ptr__->bandwidth).bits_per_second_ = uVar9;
      (__return_storage_ptr__->rtt).time_offset_ = ack_time.time_ - (sent_packet->sent_time).time_;
      bVar6 = (sent_packet->send_time_state).is_app_limited;
      uVar5 = *(undefined6 *)&(sent_packet->send_time_state).field_0x2;
      QVar7 = (sent_packet->send_time_state).total_bytes_sent;
      QVar3 = (sent_packet->send_time_state).total_bytes_acked;
      QVar4 = (sent_packet->send_time_state).total_bytes_lost;
      (__return_storage_ptr__->state_at_send).is_valid = (sent_packet->send_time_state).is_valid;
      (__return_storage_ptr__->state_at_send).is_app_limited = bVar6;
      *(undefined6 *)&(__return_storage_ptr__->state_at_send).field_0x2 = uVar5;
      (__return_storage_ptr__->state_at_send).total_bytes_sent = QVar7;
      (__return_storage_ptr__->state_at_send).total_bytes_acked = QVar3;
      (__return_storage_ptr__->state_at_send).total_bytes_lost = QVar4;
      (__return_storage_ptr__->state_at_send).bytes_in_flight =
           (sent_packet->send_time_state).bytes_in_flight;
      (__return_storage_ptr__->state_at_send).is_valid = true;
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->state_at_send).total_bytes_lost = 0;
  (__return_storage_ptr__->state_at_send).bytes_in_flight = 0;
  (__return_storage_ptr__->state_at_send).total_bytes_sent = 0;
  (__return_storage_ptr__->state_at_send).total_bytes_acked = 0;
  (__return_storage_ptr__->bandwidth).bits_per_second_ = 0;
  (__return_storage_ptr__->rtt).time_offset_ = 0;
  (__return_storage_ptr__->state_at_send).is_valid = false;
  (__return_storage_ptr__->state_at_send).is_app_limited = false;
  return __return_storage_ptr__;
}

Assistant:

BandwidthSample BandwidthSampler::OnPacketAcknowledgedInner(
    QuicTime ack_time,
    QuicPacketNumber packet_number,
    const ConnectionStateOnSentPacket& sent_packet) {
  total_bytes_acked_ += sent_packet.size;
  total_bytes_sent_at_last_acked_packet_ =
      sent_packet.send_time_state.total_bytes_sent;
  last_acked_packet_sent_time_ = sent_packet.sent_time;
  last_acked_packet_ack_time_ = ack_time;
  if (overestimate_avoidance_) {
    recent_ack_points_.Update(ack_time, total_bytes_acked_);
  }

  if (started_as_app_limited_) {
    if (is_app_limited_) {
      // Exit app-limited phase in two cases:
      // (1) end_of_app_limited_phase_ is not initialized, i.e., so far all
      // packets are sent while there are buffered packets or pending data.
      // (2) The current acked packet is after the sent packet marked as the end
      // of the app limit phase.
      if (!end_of_app_limited_phase_.IsInitialized() ||
          packet_number > end_of_app_limited_phase_) {
       // QUIC_RELOADABLE_FLAG_COUNT(quic_bw_sampler_app_limited_starting_value);
        is_app_limited_ = false;
      }
    }
  } else {
    // Exit app-limited phase once a packet that was sent while the connection
    // is not app-limited is acknowledged.
    if (is_app_limited_ && end_of_app_limited_phase_.IsInitialized() &&
        packet_number > end_of_app_limited_phase_) {
      is_app_limited_ = false;
    }
  }

  // There might have been no packets acknowledged at the moment when the
  // current packet was sent. In that case, there is no bandwidth sample to
  // make.
  if (sent_packet.last_acked_packet_sent_time == QuicTime::Zero()) {
   // QUIC_BUG << "sent_packet.last_acked_packet_sent_time is zero";
    return BandwidthSample();
  }

  // Infinite rate indicates that the sampler is supposed to discard the
  // current send rate sample and use only the ack rate.
  QuicBandwidth send_rate = QuicBandwidth::Infinite();
  if (sent_packet.sent_time > sent_packet.last_acked_packet_sent_time) {
    send_rate = QuicBandwidth::FromBytesAndTimeDelta(
        sent_packet.send_time_state.total_bytes_sent -
            sent_packet.total_bytes_sent_at_last_acked_packet,
        sent_packet.sent_time - sent_packet.last_acked_packet_sent_time);
  }

  AckPoint a0;
  if (overestimate_avoidance_ &&
      ChooseA0Point(sent_packet.send_time_state.total_bytes_acked, &a0)) {
//    QUIC_DVLOG(2) << "Using a0 point: " << a0;
  } else {
    a0.ack_time = sent_packet.last_acked_packet_ack_time,
    a0.total_bytes_acked = sent_packet.send_time_state.total_bytes_acked;

  }

  // During the slope calculation, ensure that ack time of the current packet is
  // always larger than the time of the previous packet, otherwise division by
  // zero or integer underflow can occur.
  if (ack_time <= a0.ack_time) {
    // TODO(wub): Compare this code count before and after fixing clock jitter
    // issue.
    if (a0.ack_time == sent_packet.sent_time) {
      // This is the 1st packet after quiescense.
     // QUIC_CODE_COUNT_N(quic_prev_ack_time_larger_than_current_ack_time, 1, 2);
    } else {
      //QUIC_CODE_COUNT_N(quic_prev_ack_time_larger_than_current_ack_time, 2, 2);
    }
   // QUIC_LOG_EVERY_N_SEC(ERROR, 60)
        //<< "Time of the previously acked packet:"
        //<< a0.ack_time.ToDebuggingValue()
        //<< " is larger than the ack time of the current packet:"
        //<< ack_time.ToDebuggingValue()
        //<< ". acked packet number:" << packet_number
        //<< ", total_bytes_acked_:" << total_bytes_acked_
        //<< ", overestimate_avoidance_:" << overestimate_avoidance_
        //<< ", sent_packet:" << sent_packet;
    return BandwidthSample();
  }
  QuicBandwidth ack_rate = QuicBandwidth::FromBytesAndTimeDelta(
      total_bytes_acked_ - a0.total_bytes_acked, ack_time - a0.ack_time);

//  int aaa = packet_number.ToUint64();
//#ifdef OUTPUT_VERBOSE_INFO
//	  dd::OutputDebugInfo("packet_number = %d, acked rate = %f Mbyte/s, total_bytes_acked = %llu, ack_time = %llu, a0.total_bytes_acked = %llu, a0.ack_time = %llu\r\n",
//		   aaa, (float)ack_rate.ToBytesPerSecond() / 1024.0 / 1024.0, total_bytes_acked_, ack_time.ToDebuggingValue(),
//		   a0.total_bytes_acked, a0.ack_time.ToDebuggingValue());
//#endif

  BandwidthSample sample;
  sample.bandwidth = std::min(send_rate, ack_rate);
  // Note: this sample does not account for delayed acknowledgement time.  This
  // means that the RTT measurements here can be artificially high, especially
  // on low bandwidth connections.
  sample.rtt = ack_time - sent_packet.sent_time;
  SentPacketToSendTimeState(sent_packet, &sample.state_at_send);

  if (sample.bandwidth.IsZero()) {
    //QUIC_LOG_EVERY_N_SEC(ERROR, 60)
    //    << "ack_rate: " << ack_rate << ", send_rate: " << send_rate
    //    << ". acked packet number:" << packet_number
    //    << ", overestimate_avoidance_:" << overestimate_avoidance_ << "a1:{"
    //    << total_bytes_acked_ << "@" << ack_time << "}, a0:{"
    //    << a0.total_bytes_acked << "@" << a0.ack_time
    //    << "}, sent_packet:" << sent_packet;
  }
  return sample;
}